

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GPUShaderFP64Test7::getFragmentShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,_variables *variables)

{
  uint uVar1;
  _variable_type _Var2;
  pointer p_Var3;
  uchar uVar4;
  uint uVar5;
  uint uVar6;
  ostream *poVar7;
  ulong uVar8;
  uint uVar9;
  _variable_type type;
  _variable_type type_00;
  int iVar10;
  ulong uVar11;
  char *this_00;
  byte bVar12;
  ulong uVar13;
  string local_508 [32];
  string variable_type_string;
  stringstream result_sstream;
  ostream local_4b8;
  stringstream array_size_sstream;
  ostream local_330;
  stringstream array_index_sstream;
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&result_sstream);
  poVar7 = std::operator<<(&local_4b8,"#version 400\n\n");
  this_00 = "in GS_DATA\n{\n";
  poVar7 = std::operator<<(poVar7,"in GS_DATA\n{\n");
  getVariableDeclarations_abi_cxx11_
            ((string *)&array_size_sstream,(GPUShaderFP64Test7 *)this_00,"gs",variables,"flat");
  poVar7 = std::operator<<(poVar7,(string *)&array_size_sstream);
  poVar7 = std::operator<<(poVar7,"};\n\n");
  std::operator<<(poVar7,
                  "out vec4 result;\n\nvoid main()\n{\nconst double epsilon = 1e-5;\n\nresult = vec4(1, 0, 0, 0);\n\n"
                 );
  std::__cxx11::string::~string((string *)&array_size_sstream);
  uVar8 = ((long)(variables->
                 super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(variables->
                super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0xc;
  for (uVar9 = 0; uVar13 = (ulong)uVar9, uVar13 < uVar8; uVar9 = uVar9 + 1) {
    p_Var3 = (variables->
             super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar1 = p_Var3[uVar13].array_size;
    _Var2 = p_Var3[uVar13].type;
    uVar5 = Utils::getNumberOfComponentsForVariableType(_Var2);
    Utils::getVariableTypeString_abi_cxx11_(&variable_type_string,(Utils *)(ulong)_Var2,type);
    std::__cxx11::stringstream::stringstream((stringstream *)&array_size_sstream);
    if (1 < uVar1) {
      poVar7 = std::operator<<(&local_330,"[");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::operator<<(poVar7,"]");
    }
    poVar7 = std::operator<<(&local_4b8,(string *)&variable_type_string);
    poVar7 = std::operator<<(poVar7," expected_variable");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__cxx11::stringbuf::str();
    poVar7 = std::operator<<(poVar7,(string *)&array_index_sstream);
    std::operator<<(poVar7,";\n\n");
    std::__cxx11::string::~string((string *)&array_index_sstream);
    for (uVar13 = 0; uVar13 != uVar1; uVar13 = uVar13 + 1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&array_index_sstream);
      if (1 < uVar1) {
        poVar7 = std::operator<<(&local_1a8,"[");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::operator<<(poVar7,"]");
      }
      poVar7 = std::operator<<(&local_4b8,"expected_variable");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__cxx11::stringbuf::str();
      poVar7 = std::operator<<(poVar7,local_508);
      poVar7 = std::operator<<(poVar7," = ");
      poVar7 = std::operator<<(poVar7,(string *)&variable_type_string);
      std::operator<<(poVar7,"(");
      std::__cxx11::string::~string(local_508);
      iVar10 = 0;
      while( true ) {
        if (uVar5 + iVar10 == 0) break;
        std::ostream::_M_insert<unsigned_long>((ulong)&local_4b8);
        if (uVar5 + iVar10 != 1) {
          std::operator<<(&local_4b8,", ");
        }
        iVar10 = iVar10 + -1;
      }
      std::operator<<(&local_4b8,");\n");
      std::__cxx11::stringstream::~stringstream((stringstream *)&array_index_sstream);
    }
    std::operator<<(&local_4b8,"\n");
    std::__cxx11::stringstream::~stringstream((stringstream *)&array_size_sstream);
    std::__cxx11::string::~string((string *)&variable_type_string);
  }
  std::operator<<(&local_4b8,"if (");
  for (uVar9 = 0; uVar13 = (ulong)uVar9, uVar13 < uVar8; uVar9 = uVar9 + 1) {
    p_Var3 = (variables->
             super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar1 = p_Var3[uVar13].array_size;
    _Var2 = p_Var3[uVar13].type;
    uVar5 = Utils::getNumberOfComponentsForVariableType(_Var2);
    Utils::getVariableTypeString_abi_cxx11_(&variable_type_string,(Utils *)(ulong)_Var2,type_00);
    bVar12 = _Var2 < VARIABLE_TYPE_UINT & (byte)(0x7fc03fe0 >> ((byte)_Var2 & 0x1f));
    for (uVar13 = 0; uVar13 != uVar1; uVar13 = uVar13 + 1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&array_size_sstream);
      if (1 < uVar1) {
        poVar7 = std::operator<<(&local_330,"[");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::operator<<(poVar7,"]");
      }
      for (uVar11 = 0; uVar5 != uVar11; uVar11 = uVar11 + 1) {
        std::__cxx11::stringstream::stringstream((stringstream *)&array_index_sstream);
        if (1 < uVar5) {
          poVar7 = std::operator<<(&local_1a8,"[");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::operator<<(poVar7,"]");
        }
        poVar7 = std::operator<<(&local_4b8,"abs(expected_variable");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::__cxx11::stringbuf::str();
        std::operator<<(poVar7,local_508);
        std::__cxx11::string::~string(local_508);
        if (bVar12 == 0) {
          std::__cxx11::stringbuf::str();
          std::operator<<(&local_4b8,local_508);
          std::__cxx11::string::~string(local_508);
        }
        else {
          uVar6 = Utils::getNumberOfColumnsForVariableType(_Var2);
          poVar7 = std::operator<<(&local_4b8,"[");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7,"].");
          uVar4 = Utils::getComponentAtIndex((uint)((uVar11 & 0xffffffff) / (ulong)uVar6));
          std::operator<<(poVar7,uVar4);
        }
        poVar7 = std::operator<<(&local_4b8," - gs_variable");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::__cxx11::stringbuf::str();
        std::operator<<(poVar7,local_508);
        std::__cxx11::string::~string(local_508);
        if (bVar12 == 0) {
          std::__cxx11::stringbuf::str();
          std::operator<<(&local_4b8,local_508);
          std::__cxx11::string::~string(local_508);
        }
        else {
          uVar6 = Utils::getNumberOfColumnsForVariableType(_Var2);
          poVar7 = std::operator<<(&local_4b8,"[");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7,"].");
          uVar4 = Utils::getComponentAtIndex((uint)((uVar11 & 0xffffffff) / (ulong)uVar6));
          std::operator<<(poVar7,uVar4);
        }
        std::operator<<(&local_4b8,") <= epsilon &&");
        std::__cxx11::stringstream::~stringstream((stringstream *)&array_index_sstream);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&array_size_sstream);
    }
    std::__cxx11::string::~string((string *)&variable_type_string);
  }
  std::operator<<(&local_4b8,"true)\n{\n    result = vec4(0, 1, 0, 0);\n}\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&result_sstream);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test7::getFragmentShaderBody(const _variables& variables)
{
	std::stringstream result_sstream;

	/* Form the pre-amble */
	result_sstream << "#version 400\n"
					  "\n"

				   /* Add input block */
				   << "in GS_DATA\n"
					  "{\n"
				   << getVariableDeclarations("gs", variables, "flat") << "};\n"
																		  "\n"

				   /* Add output variable */
				   << "out vec4 result;\n"
					  "\n"

					  /* Add main() definition */
					  "void main()\n"
					  "{\n"
					  "const double epsilon = 1e-5;\n"
					  "\n"
					  "result = vec4(1, 0, 0, 0);\n"
					  "\n";

	/* Determine expected values first */
	unsigned int base_counter = 1;
	const size_t n_variables  = variables.size();

	for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
	{
		unsigned int		  variable_array_size		 = variables[n_variable].array_size;
		Utils::_variable_type variable_type				 = variables[n_variable].type;
		unsigned int		  n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
		std::string			  variable_type_string		 = Utils::getVariableTypeString(variable_type);

		std::stringstream array_size_sstream;

		if (variable_array_size > 1)
		{
			array_size_sstream << "[" << variable_array_size << "]";
		}

		/* Local variable declaration */
		result_sstream << variable_type_string << " expected_variable" << n_variable << array_size_sstream.str()
					   << ";\n"
						  "\n";

		/* Set expected values */
		for (unsigned int index = 0; index < variable_array_size; ++index)
		{
			std::stringstream array_index_sstream;

			if (variable_array_size > 1)
			{
				array_index_sstream << "[" << index << "]";
			}

			result_sstream << "expected_variable" << n_variable << array_index_sstream.str() << " = "
						   << variable_type_string << "(";

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				unsigned int expected_value =
					(base_counter + 0) + (base_counter + 1) + (base_counter + 2) + (base_counter + 3);

				if (m_are_double_inputs_supported)
				{
					/* VS input attributes */
					//expected_value += (base_counter + 6);
					expected_value -= 1;
				}

				result_sstream << expected_value;

				if (n_component != (n_variable_type_components - 1))
				{
					result_sstream << ", ";
				}

				++base_counter;
			} /* for (all components) */

			result_sstream << ");\n";
		} /* for (all array indices) */

		result_sstream << "\n";
	} /* for (all variable types) */

	/* Now that we know the expected values, do a huge conditional check to verify if all
	 * input variables carry correct information.
	 */
	result_sstream << "if (";

	for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
	{
		unsigned int		  variable_array_size		 = variables[n_variable].array_size;
		Utils::_variable_type variable_type				 = variables[n_variable].type;
		bool				  is_variable_type_matrix	= Utils::isMatrixVariableType(variable_type);
		unsigned int		  n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
		std::string			  variable_type_string		 = Utils::getVariableTypeString(variable_type);

		for (unsigned int index = 0; index < variable_array_size; ++index)
		{
			std::stringstream array_index_sstream;

			if (variable_array_size > 1)
			{
				array_index_sstream << "[" << index << "]";
			}

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				std::stringstream component_index_sstream;

				if (n_variable_type_components > 1)
				{
					component_index_sstream << "[" << n_component << "]";
				}

				result_sstream << "abs(expected_variable" << n_variable << array_index_sstream.str();

				if (is_variable_type_matrix)
				{
					const unsigned int n_columns = Utils::getNumberOfColumnsForVariableType(variable_type);
					const unsigned int column	= n_component % n_columns;
					const unsigned int row		 = n_component / n_columns;

					result_sstream << "[" << column << "]"
													   "."
								   << Utils::getComponentAtIndex(row);
				}
				else
				{
					result_sstream << component_index_sstream.str();
				}

				result_sstream << " - gs_variable" << n_variable << array_index_sstream.str();

				if (is_variable_type_matrix)
				{
					const unsigned int n_columns = Utils::getNumberOfColumnsForVariableType(variable_type);
					const unsigned int column	= n_component % n_columns;
					const unsigned int row		 = n_component / n_columns;

					result_sstream << "[" << column << "]"
													   "."
								   << Utils::getComponentAtIndex(row);
				}
				else
				{
					result_sstream << component_index_sstream.str();
				}

				result_sstream << ") <= epsilon &&";
			} /* for (all components) */
		}	 /* for (all array indices) */
	}		  /* for (all variable types) */

	result_sstream << "true)\n"
					  "{\n"
					  "    result = vec4(0, 1, 0, 0);\n"
					  "}\n"
					  "}\n";

	/* All done */
	return result_sstream.str();
}